

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  bool bVar1;
  Type TVar2;
  reference this_00;
  size_t sVar3;
  UnknownField *field;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedField<google::protobuf::UnknownField> *__range2;
  size_t total_size;
  UnknownFieldSet *this_local;
  
  bVar1 = RepeatedField<google::protobuf::UnknownField>::empty(&this->fields_);
  if (bVar1) {
    this_local = (UnknownFieldSet *)0x0;
  }
  else {
    __range2 = (RepeatedField<google::protobuf::UnknownField> *)
               RepeatedField<google::protobuf::UnknownField>::SpaceUsedExcludingSelfLong
                         (&this->fields_);
    __end2 = RepeatedField<google::protobuf::UnknownField>::begin(&this->fields_);
    field = (UnknownField *)RepeatedField<google::protobuf::UnknownField>::end(&this->fields_);
    while (bVar1 = internal::operator!=(&__end2,(iterator *)&field), bVar1) {
      this_00 = internal::RepeatedIterator<const_google::protobuf::UnknownField>::operator*(&__end2)
      ;
      TVar2 = UnknownField::type(this_00);
      if (TVar2 == TYPE_LENGTH_DELIMITED) {
        sVar3 = internal::StringSpaceUsedExcludingSelfLong((this_00->data_).string_value);
        __range2 = (RepeatedField<google::protobuf::UnknownField> *)
                   ((long)&__range2[2].soo_rep_.field_0 + sVar3);
      }
      else if (TVar2 == TYPE_GROUP) {
        sVar3 = SpaceUsedLong((this_00->data_).group);
        __range2 = (RepeatedField<google::protobuf::UnknownField> *)
                   ((long)&(__range2->soo_rep_).field_0 + sVar3);
      }
      internal::RepeatedIterator<const_google::protobuf::UnknownField>::operator++(&__end2);
    }
    this_local = (UnknownFieldSet *)__range2;
  }
  return (size_t)this_local;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_.empty()) return 0;

  size_t total_size = fields_.SpaceUsedExcludingSelfLong();

  for (const UnknownField& field : fields_) {
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.string_value) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.string_value);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}